

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O3

lys_module *
ly_ctx_load_sub_module
          (ly_ctx *ctx,lys_module *module,char *name,char *revision,int implement,
          unres_schema *unres)

{
  ly_ctx *plVar1;
  int iVar2;
  lys_module *plVar3;
  char *data;
  LY_ERR *pLVar4;
  lys_revision *plVar5;
  long lVar6;
  _func_void_void_ptr *local_50;
  _func_void_void_ptr *module_data_free;
  ly_ctx *local_40;
  LYS_INFORMAT local_34 [2];
  LYS_INFORMAT format;
  
  local_50 = (_func_void_void_ptr *)0x0;
  local_34[0] = LYS_IN_UNKNOWN;
  if (module == (lys_module *)0x0) {
    lVar6 = 0;
    module_data_free = (_func_void_void_ptr *)module;
    local_40 = ctx;
    do {
      while (iVar2 = ly_strequal_(name,internal_modules[lVar6].name), iVar2 == 0) {
        lVar6 = lVar6 + 1;
        if (lVar6 == 5) {
          if (revision == (char *)0x0) goto LAB_001104b5;
          goto LAB_00110456;
        }
      }
      if (revision == (char *)0x0) {
        revision = (char *)0x0;
LAB_00110595:
        plVar3 = ly_ctx_get_module_by(local_40,name,8,revision,0);
        return plVar3;
      }
      iVar2 = ly_strequal_(revision,internal_modules[lVar6].revision);
      if (iVar2 != 0) goto LAB_00110595;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 5);
LAB_00110456:
    plVar1 = local_40;
    if (5 < (local_40->models).used) {
      lVar6 = 5;
      do {
        plVar3 = (plVar1->models).list[lVar6];
        iVar2 = ly_strequal_(name,plVar3->name);
        if (((iVar2 != 0) && (plVar3->rev_size != '\0')) &&
           (iVar2 = strcmp(revision,plVar3->rev->date), iVar2 == 0)) {
          iVar2 = lys_set_implemented(plVar3);
          if (iVar2 != 0) {
            return (lys_module *)0x0;
          }
          return plVar3;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < (plVar1->models).used);
    }
LAB_001104b5:
    plVar1 = local_40;
    module = (lys_module *)module_data_free;
    ctx = local_40;
    if (local_40->imp_clb == (ly_module_imp_clb)0x0) goto LAB_0011050c;
    data = (*local_40->imp_clb)
                     (name,revision,(char *)0x0,(char *)0x0,local_40->imp_clb_data,local_34,
                      &local_50);
    if (data == (char *)0x0) {
      if (revision == (char *)0x0) {
        plVar3 = ly_ctx_get_module_by(plVar1,name,8,(char *)0x0,1);
        if (plVar3 == (lys_module *)0x0) {
          return (lys_module *)0x0;
        }
        if ((plVar3->field_0x40 & 0x40) == 0) {
          return plVar3;
        }
        lys_set_enabled(plVar3);
        return plVar3;
      }
      goto LAB_001105b0;
    }
    plVar3 = lys_parse_mem(plVar1,data,local_34[0]);
  }
  else {
    if (ctx->imp_clb == (ly_module_imp_clb)0x0) {
LAB_0011050c:
      plVar3 = lyp_search_file(ctx,module,name,revision,implement,unres);
      return plVar3;
    }
    module_data_free = (_func_void_void_ptr *)module;
    plVar3 = lys_main_module(module);
    if (plVar3->rev_size == '\0') {
      plVar5 = (lys_revision *)0x0;
    }
    else {
      plVar5 = plVar3->rev;
    }
    data = (*ctx->imp_clb)(plVar3->name,plVar5->date,name,revision,ctx->imp_clb_data,local_34,
                           &local_50);
    if (data == (char *)0x0) {
LAB_001105b0:
      pLVar4 = ly_errno_location();
      *pLVar4 = LY_ESYS;
      ly_log(LY_LLERR,"User module retrieval callback failed!");
      return (lys_module *)0x0;
    }
    plVar3 = (lys_module *)lys_sub_parse_mem((lys_module *)module_data_free,data,local_34[0],unres);
  }
  if (local_50 != (_func_void_void_ptr *)0x0) {
    (*local_50)(data);
  }
  return plVar3;
}

Assistant:

const struct lys_module *
ly_ctx_load_sub_module(struct ly_ctx *ctx, struct lys_module *module, const char *name, const char *revision,
                       int implement, struct unres_schema *unres)
{
    const struct lys_module *mod;
    char *module_data;
    int i;
    void (*module_data_free)(void *module_data) = NULL;
    LYS_INFORMAT format = LYS_IN_UNKNOWN;

    if (!module) {
        /* exception for internal modules */
        for (i = 0; i < INTERNAL_MODULES_COUNT; i++) {
            if (ly_strequal(name, internal_modules[i].name, 0)) {
                if (!revision || ly_strequal(revision, internal_modules[i].revision, 0)) {
                    /* return internal module */
                    return (struct lys_module *)ly_ctx_get_module(ctx, name, revision);
                }
            }
        }
        if (revision) {
            /* try to get the schema with the specific revision from the context,
             * include the disabled modules in the search to avoid their duplication,
             * they are enabled by the subsequent call to lys_set_implemented() */
            for (i = INTERNAL_MODULES_COUNT, mod = NULL; i < ctx->models.used; i++) {
                mod = ctx->models.list[i]; /* shortcut */
                if (ly_strequal(name, mod->name, 0) && mod->rev_size && !strcmp(revision, mod->rev[0].date)) {
                    break;
                }
                mod = NULL;
            }
            if (mod) {
                /* we get such a module, make it implemented */
                if (lys_set_implemented(mod)) {
                    /* the schema cannot be implemented */
                    mod = NULL;
                }
                return mod;
            }
        }
    }

    if (ctx->imp_clb) {
        if (module) {
            mod = lys_main_module(module);
            module_data = ctx->imp_clb(mod->name, (mod->rev_size ? mod->rev[0].date : NULL), name, revision, ctx->imp_clb_data, &format, &module_data_free);
        } else {
            module_data = ctx->imp_clb(name, revision, NULL, NULL, ctx->imp_clb_data, &format, &module_data_free);
        }
        if (!module_data) {
            if (module || revision) {
                /* we already know that the specified revision is not present in context, and we have no other
                 * option in case of submodules */
                LOGERR(LY_ESYS, "User module retrieval callback failed!");
                return NULL;
            } else {
                /* get the newest revision from the context */
                mod = ly_ctx_get_module_by(ctx, name, offsetof(struct lys_module, name), revision, 1);
                if (mod && mod->disabled) {
                    /* enable the required module */
                    lys_set_enabled(mod);
                }
                return mod;
            }
        }

        if (module) {
            mod = (struct lys_module *)lys_sub_parse_mem(module, module_data, format, unres);
        } else {
            mod = (struct lys_module *)lys_parse_mem(ctx, module_data, format);
        }

        if (module_data_free) {
            module_data_free(module_data);
        }
    } else {
        mod = lyp_search_file(ctx, module, name, revision, implement, unres);
    }

    return mod;
}